

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

Node * hashkey(GCtab *t,cTValue *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  cTValue *key_local;
  GCtab *t_local;
  Node *n_3;
  Node *n_2;
  Node *n_1;
  Node *n;
  
  if ((key->field_2).it == 0xfffffffb) {
    t_local = (GCtab *)((ulong)(t->node).ptr32 +
                       (ulong)(*(uint *)((ulong)(key->u32).lo + 8) & t->hmask) * 0x18);
  }
  else if ((key->field_2).it < 0xfffeffff) {
    uVar1 = (key->field_2).it << 1;
    uVar2 = (key->field_2).it << 0xf;
    uVar3 = uVar2 | uVar1 >> 0x12;
    uVar1 = (uVar1 ^ (key->u32).lo) - uVar3;
    t_local = (GCtab *)((ulong)(t->node).ptr32 +
                       (ulong)((uVar1 ^ (uVar3 << 5 | uVar2 >> 0x1b)) -
                               (uVar1 * 0x2000 | uVar1 >> 0x13) & t->hmask) * 0x18);
  }
  else if (((key->field_2).it == 0xfffffffe) || ((key->field_2).it == 0xfffffffd)) {
    t_local = (GCtab *)((ulong)(t->node).ptr32 + (ulong)(-(key->field_2).it - 2 & t->hmask) * 0x18);
  }
  else {
    uVar1 = (key->u32).lo + 0xfb3ee249;
    uVar2 = uVar1 * 0x4000 | uVar1 >> 0x12;
    uVar3 = (uVar1 ^ (key->u32).lo) - uVar2;
    t_local = (GCtab *)((ulong)(t->node).ptr32 +
                       (ulong)((uVar3 ^ (uVar2 << 5 | uVar1 * 0x4000 >> 0x1b)) -
                               (uVar3 * 0x2000 | uVar3 >> 0x13) & t->hmask) * 0x18);
  }
  return (Node *)t_local;
}

Assistant:

static Node *hashkey(const GCtab *t, cTValue *key)
{
  lua_assert(!tvisint(key));
  if (tvisstr(key))
    return hashstr(t, strV(key));
  else if (tvisnum(key))
    return hashnum(t, key);
  else if (tvisbool(key))
    return hashmask(t, boolV(key));
  else
    return hashgcref(t, key->gcr);
  /* Only hash 32 bits of lightuserdata on a 64 bit CPU. Good enough? */
}